

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O1

void __thiscall duckdb::TopNHeap::Combine(TopNHeap *this,TopNHeap *other)

{
  pointer *ppTVar1;
  pointer pTVar2;
  pointer pTVar3;
  iterator __position;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  pointer pTVar7;
  long lVar8;
  long lVar9;
  idx_t sel_count;
  ulong uVar10;
  anon_union_16_2_67f50693_for_value local_a8;
  idx_t local_98;
  TopNHeap *local_88;
  SelectionVector *local_80;
  DataChunk *local_78;
  DataChunk *local_70;
  vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>> *local_68;
  StringHeap *local_60;
  pointer local_58;
  ulong local_50;
  anon_union_16_2_67f50693_for_value local_48;
  idx_t local_38;
  
  pTVar7 = (other->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
           super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((other->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
      super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
      super__Vector_impl_data._M_finish == pTVar7) {
    sel_count = 0;
  }
  else {
    local_68 = (vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>> *)&this->heap;
    local_60 = &this->sort_key_heap;
    local_78 = &this->heap_data;
    local_80 = &this->matching_sel;
    local_70 = &other->heap_data;
    sel_count = 0;
    uVar10 = 0;
    local_88 = other;
    do {
      pTVar7 = pTVar7 + uVar10;
      pTVar2 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
               super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar5 = true;
      if (this->heap_size <=
          (ulong)(((long)(this->heap).
                         super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                         super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) *
                 -0x5555555555555555)) {
        bVar5 = string_t::StringComparisonOperators::GreaterThan
                          (&pTVar2->sort_key,&pTVar7->sort_key);
      }
      if (bVar5 != false) {
        if ((pTVar7->sort_key).value.pointer.length < 0xd) {
          local_48.pointer = (pTVar7->sort_key).value.pointer;
        }
        else {
          local_48.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringHeap::AddBlob(local_60,&pTVar7->sort_key);
        }
        local_38 = (this->heap_data).count + sel_count;
        pTVar2 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                 super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar3 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                 super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (this->heap_size <= (ulong)(((long)pTVar3 - (long)pTVar2 >> 3) * -0x5555555555555555)) {
          if (0x18 < (long)pTVar3 - (long)pTVar2) {
            local_98 = pTVar3[-1].index;
            local_a8._0_8_ = *(undefined8 *)&pTVar3[-1].sort_key.value;
            local_a8.pointer.ptr = pTVar3[-1].sort_key.value.pointer.ptr;
            pcVar4 = *(char **)((long)&(pTVar2->sort_key).value + 8);
            *(undefined8 *)&pTVar3[-1].sort_key.value = *(undefined8 *)&(pTVar2->sort_key).value;
            pTVar3[-1].sort_key.value.pointer.ptr = pcVar4;
            pTVar3[-1].index = pTVar2->index;
            ::std::
            __adjust_heap<__gnu_cxx::__normal_iterator<duckdb::TopNEntry*,std::vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>>>,long,duckdb::TopNEntry,__gnu_cxx::__ops::_Iter_less_iter>
                      (pTVar2,0,((long)pTVar3 + (-0x18 - (long)pTVar2) >> 3) * -0x5555555555555555);
          }
          ppTVar1 = &(this->heap).
                     super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppTVar1 = *ppTVar1 + -1;
        }
        __position._M_current =
             (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
             super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_58 = pTVar7;
        if (__position._M_current ==
            (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
            super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>>::
          _M_realloc_insert<duckdb::TopNEntry_const&>
                    (local_68,__position,(TopNEntry *)&local_48.pointer);
        }
        else {
          (__position._M_current)->index = local_38;
          *(undefined8 *)&((__position._M_current)->sort_key).value = local_48._0_8_;
          ((__position._M_current)->sort_key).value.pointer.ptr = local_48.pointer.ptr;
          ppTVar1 = &(this->heap).
                     super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppTVar1 = *ppTVar1 + 1;
        }
        pTVar7 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                 super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar2 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                 super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_98 = pTVar2[-1].index;
        local_a8._0_8_ = *(undefined8 *)&pTVar2[-1].sort_key.value;
        local_a8.pointer.ptr = pTVar2[-1].sort_key.value.pointer.ptr;
        lVar8 = ((long)pTVar2 - (long)pTVar7 >> 3) * -0x5555555555555555 + -1;
        local_50 = sel_count;
        if (0x18 < (long)pTVar2 - (long)pTVar7) {
          do {
            lVar9 = (lVar8 - (lVar8 + -1 >> 0x3f)) + -1 >> 1;
            pTVar2 = pTVar7 + lVar9;
            bVar6 = string_t::StringComparisonOperators::GreaterThan
                              ((string_t *)&local_a8.pointer,&pTVar2->sort_key);
            if (!bVar6) break;
            pTVar7[lVar8].index = pTVar2->index;
            pcVar4 = (pTVar2->sort_key).value.pointer.ptr;
            *(undefined8 *)&pTVar7[lVar8].sort_key.value = *(undefined8 *)&(pTVar2->sort_key).value;
            *(char **)((long)&pTVar7[lVar8].sort_key.value + 8) = pcVar4;
            bVar6 = 2 < lVar8;
            lVar8 = lVar9;
          } while (bVar6);
        }
        pTVar7[lVar8].index = local_98;
        *(undefined8 *)&pTVar7[lVar8].sort_key.value = local_a8._0_8_;
        *(char **)((long)&pTVar7[lVar8].sort_key.value + 8) = local_a8.pointer.ptr;
        local_80->sel_vector[local_50] = (sel_t)local_58->index;
        sel_count = local_50 + 1;
        other = local_88;
        if (0x7ff < sel_count) {
          DataChunk::Append(local_78,local_70,true,local_80,sel_count);
          sel_count = 0;
          other = local_88;
        }
      }
      if (bVar5 == false) break;
      uVar10 = uVar10 + 1;
      pTVar7 = (other->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
               super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)(((long)(other->heap).
                                     super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>
                                     .
                                     super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7 >> 3)
                             * -0x5555555555555555));
  }
  if (sel_count != 0) {
    DataChunk::Append(&this->heap_data,&other->heap_data,true,&this->matching_sel,sel_count);
  }
  Reduce(this);
  return;
}

Assistant:

void TopNHeap::Combine(TopNHeap &other) {
	// "other" is sorted at this point
	idx_t match_count = 0;
	// merge the heap of other into this
	for (idx_t i = 0; i < other.heap.size(); i++) {
		// heap is full - check the latest entry
		auto &other_entry = other.heap[i];
		auto &sort_key = other_entry.sort_key;
		if (!EntryShouldBeAdded(sort_key)) {
			break; // We can break out of the loop here since we sorted the heap
		}
		// add this entry
		TopNEntry new_entry;
		new_entry.sort_key = sort_key.IsInlined() ? sort_key : sort_key_heap.AddBlob(sort_key);
		new_entry.index = heap_data.size() + match_count;
		AddEntryToHeap(new_entry);

		matching_sel.set_index(match_count++, other_entry.index);
		if (match_count >= STANDARD_VECTOR_SIZE) {
			// flush
			heap_data.Append(other.heap_data, true, &matching_sel, match_count);
			match_count = 0;
		}
	}
	if (match_count > 0) {
		// flush
		heap_data.Append(other.heap_data, true, &matching_sel, match_count);
		match_count = 0;
	}
	Reduce();
}